

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

int __thiscall
cmCTest::RunTest(cmCTest *this,vector<const_char_*,_std::allocator<const_char_*>_> *argv,
                string *output,int *retVal,ostream *log,cmDuration testTimeOut,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *environment,Encoding encoding)

{
  double dVar1;
  _Tuple_impl<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
  *p_Var2;
  pointer __p;
  _Alloc_hider __p_00;
  bool bVar3;
  uint __val;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  string *psVar7;
  cmsysProcess *cp;
  undefined4 uVar8;
  undefined8 unaff_R12;
  _Tuple_impl<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
  *p_Var9;
  cmDuration cVar10;
  cmDuration cVar11;
  undefined8 extraout_XMM0_Qb;
  undefined8 uVar12;
  cmProcessOutput processOutput;
  unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
  saveEnv;
  cmDuration local_968;
  string *local_960;
  ostream *local_958;
  allocator<char> local_94d;
  int length;
  vector<char,_std::allocator<char>_> tempOutput;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_920;
  char *data;
  double local_8f8;
  undefined8 uStack_8f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_8e0;
  _Vector_base<char,_std::allocator<char>_> local_8d8;
  string local_8c0;
  ostringstream msg;
  string strdata;
  ostringstream cmCTestLog_msg;
  string local_5a8 [1128];
  cmDuration local_140;
  string *local_c8;
  string *local_c0;
  
  if (environment ==
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    uVar8 = 0;
  }
  else {
    uVar8 = (undefined4)
            CONCAT71((int7)((ulong)unaff_R12 >> 8),
                     (environment->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start !=
                     (environment->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish);
  }
  local_960 = (string *)testTimeOut.__r;
  local_958 = log;
  cVar10 = GetRemainingTimeAllowed(this);
  local_968.__r =
       (rep_conflict)
       (~-(ulong)(cVar10.__r != 10000000.0) & (ulong)cVar10.__r |
       (ulong)(cVar10.__r + -120.0) & -(ulong)(cVar10.__r != 10000000.0));
  dVar1 = (this->TimeOut).__r;
  uVar12 = extraout_XMM0_Qb;
  if ((0.0 < dVar1) && (dVar1 < local_968.__r)) {
    uVar12 = 0;
    local_968.__r = dVar1;
  }
  cVar10.__r = local_968.__r;
  if ((0.0 < (double)local_960) &&
     (local_8f8 = local_968.__r, uStack_8f0 = uVar12, cVar11 = GetRemainingTimeAllowed(this),
     cVar10.__r = local_8f8, (double)local_960 < cVar11.__r)) {
    local_968.__r = (rep_conflict)local_960;
    cVar10.__r = (rep_conflict)local_960;
  }
  if (cVar10.__r <= 0.0) {
    local_968.__r = 1.0;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,"Test timeout computed to be: ");
  local_960 = (string *)local_968.__r;
  if ((local_968.__r != 10000000.0) || (NAN(local_968.__r))) {
    __val = cmDurationTo<unsigned_int>(&local_968);
    std::__cxx11::to_string(&strdata,__val);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&strdata,"infinite",&local_94d);
  }
  poVar6 = std::operator<<(poVar6,(string *)&strdata);
  std::operator<<(poVar6,"\n");
  std::__cxx11::string::~string((string *)&strdata);
  std::__cxx11::stringbuf::str();
  Log(this,5,
      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
      0x487,strdata._M_dataplus._M_p,false);
  std::__cxx11::string::~string((string *)&strdata);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,
             *(argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
              super__Vector_impl_data._M_start,(allocator<char> *)&strdata);
  psVar7 = cmSystemTools::GetCTestCommand_abi_cxx11_();
  bVar3 = cmsys::SystemTools::SameFile((string *)&cmCTestLog_msg,psVar7);
  if (bVar3) {
    bVar3 = this->ForceNewCTestProcess;
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    if (bVar3 == false) {
      cmCTest((cmCTest *)&cmCTestLog_msg);
      std::__cxx11::string::_M_assign(local_5a8);
      local_8f8 = (double)CONCAT44(local_8f8._4_4_,uVar8);
      local_140.__r = local_968.__r;
      local_960 = output;
      local_8e0 = environment;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&strdata);
      tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      p_Var2 = (_Tuple_impl<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
                *)(argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
      local_c8 = &strdata;
      local_c0 = &strdata;
      for (p_Var9 = (_Tuple_impl<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
                     *)(argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                       _M_impl.super__Vector_impl_data._M_start; p_Var9 != p_Var2;
          p_Var9 = p_Var9 + 1) {
        saveEnv._M_t.
        super___uniq_ptr_impl<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
        ._M_t.
        super__Tuple_impl<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
        .super__Head_base<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_false>._M_head_impl =
             *(__uniq_ptr_data<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>,_true,_true>
               *)&p_Var9->super__Head_base<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_false>;
        if ((tuple<cmSystemTools::SaveRestoreEnvironment_*,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
             )saveEnv._M_t.
              super___uniq_ptr_impl<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
              ._M_t.
              super__Tuple_impl<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
              .super__Head_base<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_false>._M_head_impl !=
            (_Head_base<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_false>)0x0) {
          iVar4 = strcmp((char *)saveEnv._M_t.
                                 super___uniq_ptr_impl<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
                                 .
                                 super__Head_base<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_false>
                                 ._M_head_impl,"--build-generator");
          if ((iVar4 == 0) &&
             (((local_968.__r != 10000000.0 || (NAN(local_968.__r))) && (0.0 < local_968.__r)))) {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const(&)[15]>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &tempOutput,(char (*) [15])"--test-timeout");
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
            cmDurationTo<unsigned_int>(&local_968);
            std::ostream::_M_insert<unsigned_long>((ulong)&msg);
            std::__cxx11::stringbuf::str();
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &tempOutput,&local_920);
            std::__cxx11::string::~string((string *)&local_920);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
          }
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &tempOutput,(char **)&saveEnv);
        }
      }
      if (local_958 != (ostream *)0x0) {
        poVar6 = std::operator<<(local_958,"* Run internal CTest");
        std::endl<char,std::char_traits<char>>(poVar6);
      }
      psVar7 = local_960;
      saveEnv._M_t.
      super___uniq_ptr_impl<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
      ._M_t.
      super__Tuple_impl<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
      .super__Head_base<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_false>._M_head_impl =
           (__uniq_ptr_data<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>,_true,_true>
            )(__uniq_ptr_impl<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
              )0x0;
      if (local_8f8._0_1_ != '\0') {
        std::make_unique<cmSystemTools::SaveRestoreEnvironment>();
        __p = _msg;
        _msg = (pointer)0x0;
        std::
        __uniq_ptr_impl<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
        ::reset((__uniq_ptr_impl<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
                 *)&saveEnv,__p);
        std::
        unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
        ::~unique_ptr((unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
                       *)&msg);
        cmSystemTools::AppendEnv(local_8e0);
      }
      iVar4 = Run((cmCTest *)&cmCTestLog_msg,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&tempOutput,psVar7);
      *retVal = iVar4;
      if (psVar7 != (string *)0x0) {
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::append((string *)psVar7);
        std::__cxx11::string::~string((string *)&msg);
        if (local_958 != (ostream *)0x0) {
          std::operator<<(local_958,(string *)psVar7);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
        poVar6 = std::operator<<((ostream *)&msg,"Internal cmCTest object used to run test.");
        poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
        poVar6 = std::operator<<(poVar6,(string *)psVar7);
        std::endl<char,std::char_traits<char>>(poVar6);
        std::__cxx11::stringbuf::str();
        Log(this,5,
            "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx"
            ,0x4b8,local_920._M_dataplus._M_p,false);
        std::__cxx11::string::~string((string *)&local_920);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
      }
      std::
      unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
      ::~unique_ptr(&saveEnv);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&tempOutput);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&strdata);
      ~cmCTest((cmCTest *)&cmCTestLog_msg);
      return 4;
    }
  }
  else {
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  }
  tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (output != (string *)0x0) {
    output->_M_string_length = 0;
    *(output->_M_dataplus)._M_p = '\0';
  }
  saveEnv._M_t.
  super___uniq_ptr_impl<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
  .super__Head_base<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_false>._M_head_impl =
       (__uniq_ptr_data<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>,_true,_true>
        )(__uniq_ptr_impl<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
          )0x0;
  if ((char)uVar8 != '\0') {
    std::make_unique<cmSystemTools::SaveRestoreEnvironment>();
    __p_00._M_p = _cmCTestLog_msg;
    _cmCTestLog_msg = (pointer)0x0;
    std::
    __uniq_ptr_impl<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
    ::reset((__uniq_ptr_impl<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
             *)&saveEnv,(pointer)__p_00._M_p);
    std::
    unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
    ::~unique_ptr((unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
                   *)&cmCTestLog_msg);
    cmSystemTools::AppendEnv(environment);
  }
  cp = cmsysProcess_New();
  cmsysProcess_SetCommand
            (cp,(argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
                super__Vector_impl_data._M_start);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,"Command is: ");
  poVar6 = std::operator<<(poVar6,*(argv->
                                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                                   _M_impl.super__Vector_impl_data._M_start);
  std::endl<char,std::char_traits<char>>(poVar6);
  std::__cxx11::stringbuf::str();
  Log(this,0,
      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
      0x4ca,strdata._M_dataplus._M_p,false);
  std::__cxx11::string::~string((string *)&strdata);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  if (cmSystemTools::s_RunCommandHideConsole == true) {
    cmsysProcess_SetOption(cp,0,1);
  }
  cmsysProcess_SetTimeout(cp,local_968.__r);
  cmsysProcess_Execute(cp);
  cmProcessOutput::cmProcessOutput(&processOutput,encoding,0x400);
  strdata._M_dataplus._M_p = (pointer)&strdata.field_2;
  strdata._M_string_length = 0;
  strdata.field_2._M_local_buf[0] = '\0';
  while (iVar4 = cmsysProcess_WaitForData(cp,&data,&length,(double *)0x0), iVar4 != 0) {
    cmProcessOutput::DecodeText(&processOutput,data,(long)length,&strdata,0);
    if (output != (string *)0x0) {
      std::vector<char,std::allocator<char>>::insert<char*,void>
                ((vector<char,std::allocator<char>> *)&tempOutput,
                 (const_iterator)
                 tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish,data,data + length);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    _msg = (pointer)strdata._M_dataplus._M_p;
    operator<<((ostream *)&cmCTestLog_msg,(cmCTestLogWrite *)&msg);
    std::__cxx11::stringbuf::str();
    Log(this,5,
        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
        0x4dc,(char *)_msg,false);
    std::__cxx11::string::~string((string *)&msg);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    if (local_958 != (ostream *)0x0) {
      std::ostream::write((char *)local_958,(long)strdata._M_dataplus._M_p);
    }
  }
  local_8c0._M_dataplus._M_p = (pointer)&local_8c0.field_2;
  local_8c0._M_string_length = 0;
  local_8c0.field_2._M_local_buf[0] = '\0';
  cmProcessOutput::DecodeText(&processOutput,&local_8c0,&strdata,0);
  std::__cxx11::string::~string((string *)&local_8c0);
  if (strdata._M_string_length != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    _msg = (pointer)strdata._M_dataplus._M_p;
    operator<<((ostream *)&cmCTestLog_msg,(cmCTestLogWrite *)&msg);
    std::__cxx11::stringbuf::str();
    Log(this,5,
        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
        0x4e4,(char *)_msg,false);
    std::__cxx11::string::~string((string *)&msg);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    if (local_958 != (ostream *)0x0) {
      std::ostream::write((char *)local_958,(long)strdata._M_dataplus._M_p);
    }
  }
  cmsysProcess_WaitForExit(cp,(double *)0x0);
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_8d8,&tempOutput);
  cmProcessOutput::DecodeText
            (&processOutput,(vector<char,_std::allocator<char>_> *)&local_8d8,&tempOutput,0);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_8d8);
  if ((output != (string *)0x0) &&
     (tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish)) {
    std::__cxx11::string::append
              ((char *)output,
               (ulong)tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,"-- Process completed");
  std::endl<char,std::char_traits<char>>(poVar6);
  std::__cxx11::stringbuf::str();
  Log(this,5,
      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
      0x4f0,(char *)_msg,false);
  std::__cxx11::string::~string((string *)&msg);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  iVar4 = cmsysProcess_GetState(cp);
  if (iVar4 == 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&msg,"\n*** ERROR executing: ",(allocator<char> *)&cmCTestLog_msg);
    cmsysProcess_GetErrorString(cp);
    std::__cxx11::string::append((char *)&msg);
    if (output != (string *)0x0) {
      std::__cxx11::string::append((string *)output);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,(string *)&msg);
    std::endl<char,std::char_traits<char>>(poVar6);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,5,
        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
        0x50e,local_920._M_dataplus._M_p,false);
  }
  else {
    if (iVar4 != 2) {
      if (iVar4 == 4) {
        iVar5 = cmsysProcess_GetExitValue(cp);
        *retVal = iVar5;
        if ((iVar5 != 0) && (this->OutputTestOutputOnTestFailure == true)) {
          OutputTestErrors(this,&tempOutput);
        }
      }
      goto LAB_00145f93;
    }
    if (this->OutputTestOutputOnTestFailure == true) {
      OutputTestErrors(this,&tempOutput);
    }
    iVar5 = cmsysProcess_GetExitException(cp);
    *retVal = iVar5;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&msg,"\n*** Exception executing: ",(allocator<char> *)&cmCTestLog_msg);
    cmsysProcess_GetExceptionString(cp);
    std::__cxx11::string::append((char *)&msg);
    if (output != (string *)0x0) {
      std::__cxx11::string::append((string *)output);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,(string *)&msg);
    std::endl<char,std::char_traits<char>>(poVar6);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,5,
        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
        0x505,local_920._M_dataplus._M_p,false);
  }
  std::__cxx11::string::~string((string *)&local_920);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&msg);
LAB_00145f93:
  cmsysProcess_Delete(cp);
  std::__cxx11::string::~string((string *)&strdata);
  cmProcessOutput::~cmProcessOutput(&processOutput);
  std::
  unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
  ::~unique_ptr(&saveEnv);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&tempOutput.super__Vector_base<char,_std::allocator<char>_>);
  return iVar4;
}

Assistant:

int cmCTest::RunTest(std::vector<const char*> argv, std::string* output,
                     int* retVal, std::ostream* log, cmDuration testTimeOut,
                     std::vector<std::string>* environment, Encoding encoding)
{
  bool modifyEnv = (environment && !environment->empty());

  // determine how much time we have
  cmDuration timeout = this->GetRemainingTimeAllowed();
  if (timeout != cmCTest::MaxDuration()) {
    timeout -= std::chrono::minutes(2);
  }
  if (this->TimeOut > cmDuration::zero() && this->TimeOut < timeout) {
    timeout = this->TimeOut;
  }
  if (testTimeOut > cmDuration::zero() &&
      testTimeOut < this->GetRemainingTimeAllowed()) {
    timeout = testTimeOut;
  }

  // always have at least 1 second if we got to here
  if (timeout <= cmDuration::zero()) {
    timeout = std::chrono::seconds(1);
  }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
             "Test timeout computed to be: "
               << (timeout == cmCTest::MaxDuration()
                     ? std::string("infinite")
                     : std::to_string(cmDurationTo<unsigned int>(timeout)))
               << "\n");
  if (cmSystemTools::SameFile(argv[0], cmSystemTools::GetCTestCommand()) &&
      !this->ForceNewCTestProcess) {
    cmCTest inst;
    inst.ConfigType = this->ConfigType;
    inst.TimeOut = timeout;

    // Capture output of the child ctest.
    std::ostringstream oss;
    inst.SetStreams(&oss, &oss);

    std::vector<std::string> args;
    for (char const* i : argv) {
      if (i) {
        // make sure we pass the timeout in for any build and test
        // invocations. Since --build-generator is required this is a
        // good place to check for it, and to add the arguments in
        if (strcmp(i, "--build-generator") == 0 &&
            timeout != cmCTest::MaxDuration() &&
            timeout > cmDuration::zero()) {
          args.emplace_back("--test-timeout");
          std::ostringstream msg;
          msg << cmDurationTo<unsigned int>(timeout);
          args.push_back(msg.str());
        }
        args.emplace_back(i);
      }
    }
    if (log) {
      *log << "* Run internal CTest" << std::endl;
    }

    std::unique_ptr<cmSystemTools::SaveRestoreEnvironment> saveEnv;
    if (modifyEnv) {
      saveEnv = cm::make_unique<cmSystemTools::SaveRestoreEnvironment>();
      cmSystemTools::AppendEnv(*environment);
    }

    *retVal = inst.Run(args, output);
    if (output) {
      *output += oss.str();
    }
    if (log && output) {
      *log << *output;
    }
    if (output) {
      cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
                 "Internal cmCTest object used to run test." << std::endl
                                                             << *output
                                                             << std::endl);
    }

    return cmsysProcess_State_Exited;
  }
  std::vector<char> tempOutput;
  if (output) {
    output->clear();
  }

  std::unique_ptr<cmSystemTools::SaveRestoreEnvironment> saveEnv;
  if (modifyEnv) {
    saveEnv = cm::make_unique<cmSystemTools::SaveRestoreEnvironment>();
    cmSystemTools::AppendEnv(*environment);
  }

  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp, argv.data());
  cmCTestLog(this, DEBUG, "Command is: " << argv[0] << std::endl);
  if (cmSystemTools::GetRunCommandHideConsole()) {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
  }

  cmsysProcess_SetTimeout(cp, timeout.count());
  cmsysProcess_Execute(cp);

  char* data;
  int length;
  cmProcessOutput processOutput(encoding);
  std::string strdata;
  while (cmsysProcess_WaitForData(cp, &data, &length, nullptr)) {
    processOutput.DecodeText(data, length, strdata);
    if (output) {
      tempOutput.insert(tempOutput.end(), data, data + length);
    }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               cmCTestLogWrite(strdata.c_str(), strdata.size()));
    if (log) {
      log->write(strdata.c_str(), strdata.size());
    }
  }
  processOutput.DecodeText(std::string(), strdata);
  if (!strdata.empty()) {
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               cmCTestLogWrite(strdata.c_str(), strdata.size()));
    if (log) {
      log->write(strdata.c_str(), strdata.size());
    }
  }

  cmsysProcess_WaitForExit(cp, nullptr);
  processOutput.DecodeText(tempOutput, tempOutput);
  if (output && tempOutput.begin() != tempOutput.end()) {
    output->append(tempOutput.data(), tempOutput.size());
  }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
             "-- Process completed" << std::endl);

  int result = cmsysProcess_GetState(cp);

  if (result == cmsysProcess_State_Exited) {
    *retVal = cmsysProcess_GetExitValue(cp);
    if (*retVal != 0 && this->OutputTestOutputOnTestFailure) {
      OutputTestErrors(tempOutput);
    }
  } else if (result == cmsysProcess_State_Exception) {
    if (this->OutputTestOutputOnTestFailure) {
      OutputTestErrors(tempOutput);
    }
    *retVal = cmsysProcess_GetExitException(cp);
    std::string outerr = "\n*** Exception executing: ";
    outerr += cmsysProcess_GetExceptionString(cp);
    if (output) {
      *output += outerr;
    }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               outerr << std::endl
                      << std::flush);
  } else if (result == cmsysProcess_State_Error) {
    std::string outerr = "\n*** ERROR executing: ";
    outerr += cmsysProcess_GetErrorString(cp);
    if (output) {
      *output += outerr;
    }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               outerr << std::endl
                      << std::flush);
  }
  cmsysProcess_Delete(cp);

  return result;
}